

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ImplementationColorReadTestCase::test
          (ImplementationColorReadTestCase *this)

{
  pointer *this_00;
  TestContext *pTVar1;
  StateVerifier *pSVar2;
  bool bVar3;
  ContextInfo *pCVar4;
  reference pvVar5;
  size_type sVar6;
  value_type_conflict1 local_ac [11];
  int local_80;
  int ndx_1;
  int local_6c;
  undefined1 local_68 [4];
  int ndx;
  vector<int,_std::allocator<int>_> validColorFormats;
  vector<int,_std::allocator<int>_> validColorTypes;
  GLint defaultColorFormats [3];
  GLint defaultColorTypes [4];
  ImplementationColorReadTestCase *this_local;
  
  defaultColorFormats[1] = 0x1401;
  defaultColorFormats[2] = 0x8033;
  stack0xffffffffffffffcc = 0x190700001908;
  defaultColorFormats[0] = 0x1906;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &validColorFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_68);
  for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &validColorFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,defaultColorFormats + (long)local_6c + 1);
  }
  for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,
               (value_type_conflict1 *)
               ((long)&validColorTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + (long)local_80 * 4 + 4));
  }
  pCVar4 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_format_BGRA8888");
  if (!bVar3) {
    pCVar4 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_APPLE_texture_format_BGRA8888");
    if (!bVar3) goto LAB_019f6103;
  }
  local_ac[10] = 0x80e1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_68,local_ac + 10);
LAB_019f6103:
  pCVar4 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_read_format_bgra");
  if (bVar3) {
    local_ac[9] = 0x80e1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,local_ac + 9);
    local_ac[8] = 0x8365;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &validColorFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_ac + 8);
    local_ac[7] = 0x8366;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &validColorFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_ac + 7);
  }
  pCVar4 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_IMG_read_format");
  if (bVar3) {
    local_ac[6] = 0x80e1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,local_ac + 6);
    local_ac[5] = 0x8365;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &validColorFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_ac + 5);
  }
  pCVar4 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_NV_sRGB_formats");
  if (bVar3) {
    local_ac[4] = 0x8c46;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,local_ac + 4);
    local_ac[3] = 0x8c44;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,local_ac + 3);
  }
  pCVar4 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_NV_bgr");
  if (bVar3) {
    local_ac[2] = 0x80e0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,local_ac + 2);
  }
  pCVar4 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_rg");
  if (bVar3) {
    local_ac[1] = 0x1903;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,local_ac + 1);
    local_ac[0] = 0x8227;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_68,local_ac);
  }
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pSVar2 = this->m_verifier;
  this_00 = &validColorFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this_00,0);
  sVar6 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)this_00)
  ;
  (*pSVar2->_vptr_StateVerifier[8])(pSVar2,pTVar1,0x8b9a,pvVar5,sVar6);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pSVar2 = this->m_verifier;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_68,0);
  sVar6 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_68);
  (*pSVar2->_vptr_StateVerifier[8])(pSVar2,pTVar1,0x8b9b,pvVar5,sVar6);
  ApiCase::expectError(&this->super_ApiCase,0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &validColorFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void test (void)
	{
		const GLint defaultColorTypes[] =
		{
			GL_UNSIGNED_BYTE, GL_UNSIGNED_SHORT_4_4_4_4, GL_UNSIGNED_SHORT_5_5_5_1, GL_UNSIGNED_SHORT_5_6_5
		};
		const GLint defaultColorFormats[] =
		{
			GL_RGBA, GL_RGB, GL_ALPHA
		};

		std::vector<GLint> validColorTypes;
		std::vector<GLint> validColorFormats;

		// Defined by the spec

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(defaultColorTypes); ++ndx)
			validColorTypes.push_back(defaultColorTypes[ndx]);
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(defaultColorFormats); ++ndx)
			validColorFormats.push_back(defaultColorFormats[ndx]);

		// Extensions

		if (m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_format_BGRA8888") ||
			m_context.getContextInfo().isExtensionSupported("GL_APPLE_texture_format_BGRA8888"))
			validColorFormats.push_back(GL_BGRA);

		if (m_context.getContextInfo().isExtensionSupported("GL_EXT_read_format_bgra"))
		{
			validColorFormats.push_back(GL_BGRA);
			validColorTypes.push_back(GL_UNSIGNED_SHORT_4_4_4_4_REV);
			validColorTypes.push_back(GL_UNSIGNED_SHORT_1_5_5_5_REV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_IMG_read_format"))
		{
			validColorFormats.push_back(GL_BGRA);
			validColorTypes.push_back(GL_UNSIGNED_SHORT_4_4_4_4_REV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_NV_sRGB_formats"))
		{
			validColorFormats.push_back(GL_SLUMINANCE_NV);
			validColorFormats.push_back(GL_SLUMINANCE_ALPHA_NV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_NV_bgr"))
		{
			validColorFormats.push_back(GL_BGR_NV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_rg"))
		{
			validColorFormats.push_back(GL_RED);
			validColorFormats.push_back(GL_RG);
		}

		m_verifier->verifyIntegerAnyOf(m_testCtx, GL_IMPLEMENTATION_COLOR_READ_TYPE,	&validColorTypes[0],	validColorTypes.size());
		m_verifier->verifyIntegerAnyOf(m_testCtx, GL_IMPLEMENTATION_COLOR_READ_FORMAT,	&validColorFormats[0],	validColorFormats.size());
		expectError(GL_NO_ERROR);
	}